

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O3

void core::image::save_png_file(ConstPtr *image,string *filename,int compression_level)

{
  undefined4 uVar1;
  element_type *peVar2;
  uint uVar3;
  FILE *__stream;
  png_infop ppVar4;
  long lVar5;
  invalid_argument *this;
  FileException *this_00;
  int *piVar6;
  char *msg;
  Exception *pEVar7;
  element_type *peVar8;
  undefined1 auStack_68 [8];
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> row_pointers;
  long local_40;
  png_infop info_ptr;
  png_structp png_ptr;
  
  if ((image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr == (element_type *)0x0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Null image given");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __stream = fopen((filename->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar6 = __errno_location();
    msg = strerror(*piVar6);
    util::FileException::FileException(this_00,filename,msg);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  ppVar4 = (png_infop)png_create_write_struct("1.6.37",0,0,0);
  info_ptr = ppVar4;
  if (ppVar4 == (png_infop)0x0) {
    fclose(__stream);
    pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
    auStack_68 = (undefined1  [8])
                 &row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_68,"Out of memory","");
    util::Exception::Exception(pEVar7,(string *)auStack_68);
    __cxa_throw(pEVar7,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  lVar5 = png_create_info_struct(ppVar4);
  local_40 = lVar5;
  if (lVar5 != 0) {
    png_init_io(ppVar4,__stream);
    uVar3 = (((image->
              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_TypedImageBase<unsigned_char>).super_ImageBase.c - 1;
    if (uVar3 < 4) {
      uVar1 = *(undefined4 *)(&DAT_0013e810 + (ulong)uVar3 * 4);
      png_set_compression_level(ppVar4,compression_level);
      peVar2 = (image->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      png_set_IHDR(ppVar4,lVar5,(peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.w,
                   (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.h,8,uVar1,0,0,0);
      auStack_68 = (undefined1  [8])0x0;
      row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::resize
                ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)auStack_68,
                 (long)(((image->
                         super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->super_TypedImageBase<unsigned_char>).super_ImageBase.h);
      peVar2 = (image->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (0 < (peVar2->super_TypedImageBase<unsigned_char>).super_ImageBase.h) {
        lVar5 = 0;
        peVar8 = peVar2;
        do {
          *(pointer *)((long)auStack_68 + lVar5 * 8) =
               (peVar2->super_TypedImageBase<unsigned_char>).data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start +
               (long)(peVar8->super_TypedImageBase<unsigned_char>).super_ImageBase.c *
               (long)(int)lVar5 *
               (long)(peVar8->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
          lVar5 = lVar5 + 1;
          peVar8 = (image->
                   super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
        } while (lVar5 < (peVar8->super_TypedImageBase<unsigned_char>).super_ImageBase.h);
      }
      png_set_rows(info_ptr,local_40,auStack_68);
      png_write_png(info_ptr,local_40,0,0);
      png_write_end(info_ptr,local_40);
      png_destroy_write_struct(&info_ptr,&local_40);
      fclose(__stream);
      if (auStack_68 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_68);
      }
      return;
    }
    png_destroy_write_struct(&info_ptr,&local_40);
    fclose(__stream);
    pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
    auStack_68 = (undefined1  [8])
                 &row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_68,"Cannot determine image color type","");
    util::Exception::Exception(pEVar7,(string *)auStack_68);
    __cxa_throw(pEVar7,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  png_destroy_write_struct(&info_ptr,0);
  fclose(__stream);
  pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
  auStack_68 = (undefined1  [8])
               &row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_68,"Out of memory","");
  util::Exception::Exception(pEVar7,(string *)auStack_68);
  __cxa_throw(pEVar7,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
save_png_file (ByteImage::ConstPtr image,
    std::string const& filename, int compression_level)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    FILE *fp = std::fopen(filename.c_str(), "wb");
    if (!fp)
        throw util::FileException(filename, std::strerror(errno));

    //png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING,
    //    (png_voidp)user_error_ptr, user_error_fn, user_warning_fn);
    png_structp png_ptr = png_create_write_struct
        (PNG_LIBPNG_VER_STRING, nullptr, nullptr, nullptr);

    if (!png_ptr)
    {
        std::fclose(fp);
        throw util::Exception("Out of memory");
    }

    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr)
    {
        png_destroy_write_struct(&png_ptr, (png_infopp)nullptr);
        std::fclose(fp);
        throw util::Exception("Out of memory");
    }

    png_init_io(png_ptr, fp);

    // void write_row_callback(png_ptr, png_uint_32 row, int pass);
    //png_set_write_status_fn(png_ptr, write_row_callback);

    /* Determine color type to be written. */
    int color_type;
    switch (image->channels())
    {
        case 1: color_type = PNG_COLOR_TYPE_GRAY; break;
        case 2: color_type = PNG_COLOR_TYPE_GRAY_ALPHA; break;
        case 3: color_type = PNG_COLOR_TYPE_RGB; break;
        case 4: color_type = PNG_COLOR_TYPE_RGB_ALPHA; break;
        default:
        {
            png_destroy_write_struct(&png_ptr, &info_ptr);
            std::fclose(fp);
            throw util::Exception("Cannot determine image color type");
        }
    }

    /* Set compression level (6 seems to be the default). */
    png_set_compression_level(png_ptr, compression_level);

    /* Write image. */
    png_set_IHDR(png_ptr, info_ptr, image->width(), image->height(),
        8 /* Bit depth */, color_type, PNG_INTERLACE_NONE,
        PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

    /* Setup row pointers. */
    std::vector<png_bytep> row_pointers;
    row_pointers.resize(image->height());
    ByteImage::ImageData const& data = image->get_data();
    for (int i = 0; i < image->height(); ++i)
        row_pointers[i] = const_cast<png_bytep>(
            &data[i * image->width() * image->channels()]);

    /* Setup transformations. */
    int png_transforms = PNG_TRANSFORM_IDENTITY;
    //png_transforms |= PNG_TRANSFORM_INVERT_ALPHA;

    /* Write to file. */
    png_set_rows(png_ptr, info_ptr, &row_pointers[0]);
    png_write_png(png_ptr, info_ptr, png_transforms, nullptr);
    png_write_end(png_ptr, info_ptr);

    /* Cleanup. */
    png_destroy_write_struct(&png_ptr, &info_ptr);
    std::fclose(fp);
}